

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process.cpp
# Opt level: O2

void __thiscall Png::Png(Png *this,path *filePath)

{
  File *this_00;
  DefaultInitVec<Rgba> *this_01;
  png_structp *pppVar1;
  png_colorp *pppVar2;
  png_bytep *pppVar3;
  png_bytep ppVar4;
  png_colorp ppVar5;
  char cVar6;
  byte bVar7;
  int iVar8;
  uint uVar9;
  undefined4 extraout_var;
  streambuf *psVar10;
  long lVar11;
  png_structp ppVar12;
  png_infop ppVar13;
  char *pcVar14;
  char *pcVar15;
  size_type __n;
  int *piVar16;
  png_uint_32 y_1;
  uint uVar17;
  int iVar18;
  ulong uVar19;
  int i;
  ulong uVar20;
  png_uint_32 x;
  png_uint_32 y;
  png_uint_32 x_1;
  Rgba *pRVar21;
  Rgba local_104;
  DefaultInitVec<Rgba> *local_100;
  File *local_f8;
  uint32_t *local_f0;
  uint32_t *local_e8;
  int bitDepth;
  undefined8 local_d8;
  Png *local_d0;
  int interlaceType;
  DefaultInitVec<png_byte> row;
  ulong local_a0;
  anon_class_8_1_7f08976d interlaceTypeName;
  array<unsigned_char,_8UL> pngHeader;
  vector<std::tuple<unsigned_int,_unsigned_int>,_std::allocator<std::tuple<unsigned_int,_unsigned_int>_>_>
  conflicts;
  anon_class_24_3_904f71aa assignColor;
  vector<unsigned_int,_std::allocator<unsigned_int>_> indeterminates;
  anon_class_8_1_8991fb9c colorTypeName;
  
  this->path = filePath;
  this_00 = &this->file;
  *(undefined8 *)
   &(this->file)._file.
    super__Variant_base<std::basic_streambuf<char,_std::char_traits<char>_>_*,_std::basic_filebuf<char,_std::char_traits<char>_>_>
    .super__Move_assign_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
    super__Copy_assign_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
    super__Move_ctor_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
    super__Copy_ctor_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
    super__Variant_storage_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_> = 0;
  *(__index_type *)
   ((long)&(this->file)._file.
           super__Variant_base<std::basic_streambuf<char,_std::char_traits<char>_>_*,_std::basic_filebuf<char,_std::char_traits<char>_>_>
           .super__Move_assign_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
           super__Copy_assign_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
           super__Move_ctor_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
           super__Copy_ctor_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_> + 0xf0) =
       '\0';
  this_01 = &this->pixels;
  this->png = (png_structp)0x0;
  this->info = (png_infop)0x0;
  memset(this_01,0,0x2801d);
  std::array<std::optional<Rgba>,_32769UL>::array(&(this->colors)._colors);
  this->embeddedPal = (png_colorp)0x0;
  this->transparencyPal = (png_bytep)0x0;
  iVar8 = File::open(this_00,(char *)this->path,0xc);
  if (CONCAT44(extraout_var,iVar8) == 0) {
    File::string((string *)&row,this_00,this->path);
    piVar16 = __errno_location();
    pcVar14 = strerror(*piVar16);
    fatal("Failed to open input image (\"%s\"): %s",
          CONCAT44(row.
                   super__Vector_base<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>
                   ._M_impl.super__Vector_impl_data._M_start._4_4_,
                   (int)row.
                        super__Vector_base<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>
                        ._M_impl.super__Vector_impl_data._M_start),pcVar14);
  }
  Options::verbosePrint(&options,'\x02',"Opened input file\n");
  psVar10 = File::operator*(this_00);
  lVar11 = (**(code **)(*(long *)psVar10 + 0x40))(psVar10,&pngHeader,8);
  if ((lVar11 != 8) || (iVar8 = png_sig_cmp(&pngHeader,0,8), iVar8 != 0)) {
    File::string((string *)&row,this_00,this->path);
    fatal("Input file (\"%s\") is not a PNG image!",
          CONCAT44(row.
                   super__Vector_base<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>
                   ._M_impl.super__Vector_impl_data._M_start._4_4_,
                   (int)row.
                        super__Vector_base<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>
                        ._M_impl.super__Vector_impl_data._M_start));
  }
  Options::verbosePrint(&options,'\x03',"PNG header signature is OK\n");
  ppVar12 = (png_structp)png_create_read_struct("1.6.37",this,handleError,handleWarning);
  pppVar1 = &this->png;
  *pppVar1 = ppVar12;
  if (ppVar12 == (png_structp)0x0) {
    pcVar14 = "Failed to allocate PNG structure: %s";
  }
  else {
    ppVar13 = (png_infop)png_create_info_struct(ppVar12);
    this->info = ppVar13;
    if (ppVar13 != (png_infop)0x0) {
      png_set_read_fn(this->png,this,readData);
      png_set_sig_bytes(*pppVar1,8);
      png_read_info(this->png,this->info);
      local_f0 = &this->width;
      local_e8 = &this->height;
      local_d8 = &this->colorType;
      png_get_IHDR(this->png,this->info,local_f0,local_e8,&bitDepth,local_d8,&interlaceType,0,0);
      if ((options.inputSlice.width == 0) && ((*local_f0 & 7) != 0)) {
        pcVar14 = "Image width (%u pixels) is not a multiple of 8!";
      }
      else {
        if ((*local_e8 & 7) == 0 || options.inputSlice.height != 0) {
          std::vector<Rgba,_default_init_allocator<Rgba,_std::allocator<Rgba>_>_>::resize
                    (this_01,(ulong)*local_f0 * (ulong)*local_e8);
          iVar8 = bitDepth;
          uVar9 = this->width;
          uVar17 = this->height;
          local_100 = this_01;
          local_f8 = this_00;
          interlaceTypeName.interlaceType = &interlaceType;
          colorTypeName.this = this;
          pcVar14 = Png::anon_class_8_1_8991fb9c::operator()(&colorTypeName);
          pcVar15 = Png::anon_class_8_1_7f08976d::operator()(&interlaceTypeName);
          Options::verbosePrint
                    (&options,'\x03',"Input image: %ux%u pixels, %dbpp %s, %s\n",(ulong)uVar9,
                     (ulong)uVar17,(ulong)(uint)iVar8,pcVar14,pcVar15);
          pppVar2 = &this->embeddedPal;
          piVar16 = &this->nbColors;
          iVar8 = png_get_PLTE(this->png,this->info,pppVar2,piVar16);
          if (iVar8 == 0) {
            Options::verbosePrint(&options,'\x03',"No embedded palette\n");
          }
          else {
            pppVar3 = &this->transparencyPal;
            iVar8 = png_get_tRNS(this->png,this->info,pppVar3,&row,0);
            if ((iVar8 != 0) &&
               ((int)row.
                     super__Vector_base<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>
                     ._M_impl.super__Vector_impl_data._M_start != *piVar16)) {
              __assert_fail("nbTransparentEntries == nbColors",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/gfx/process.cpp"
                            ,0x107,"Png");
            }
            Options::verbosePrint(&options,'\x03',"Embedded palette has %d colors: [");
            lVar11 = 2;
            local_d0 = this;
            for (uVar20 = 0; this = local_d0, (long)uVar20 < (long)*piVar16; uVar20 = uVar20 + 1) {
              ppVar4 = *pppVar3;
              if (ppVar4 == (png_bytep)0x0) {
                uVar19 = 0xff;
              }
              else {
                uVar19 = (ulong)ppVar4[uVar20];
              }
              ppVar5 = *pppVar2;
              pcVar14 = ", ";
              if (uVar20 == *piVar16 - 1) {
                pcVar14 = "]\n";
              }
              Options::verbosePrint
                        (&options,'\x03',"#%02x%02x%02x%02x%s",
                         (ulong)*(byte *)((long)ppVar5 + lVar11 + -2),
                         (ulong)*(byte *)((long)ppVar5 + lVar11 + -1),(ulong)(&ppVar5->red)[lVar11],
                         uVar19,pcVar14);
              lVar11 = lVar11 + 3;
            }
          }
          if ((*local_d8 & 0xfffffffbU) == 3) {
            png_set_palette_to_rgb(*pppVar1);
          }
          else if ((*local_d8 & 0xfffffffbU) == 0) {
            png_set_gray_to_rgb(*pppVar1);
          }
          iVar8 = png_get_valid(this->png,this->info,0x10);
          if (iVar8 == 0) {
            if ((*local_d8 & 4) == 0) {
              png_set_add_alpha(*pppVar1,0xffff,1);
            }
          }
          else {
            png_set_tRNS_to_alpha(*pppVar1);
          }
          if (bitDepth == 0x10) {
            png_set_scale_16(*pppVar1);
          }
          else if (bitDepth < 8) {
            png_set_packing(*pppVar1);
          }
          png_read_update_info(this->png,this->info);
          uVar9 = png_get_image_width(this->png,this->info);
          if (uVar9 != *local_f0) {
            __assert_fail("png_get_image_width(png, info) == width",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/gfx/process.cpp"
                          ,0x138,"Png");
          }
          uVar9 = png_get_image_height(this->png,this->info);
          if (uVar9 != *local_e8) {
            __assert_fail("png_get_image_height(png, info) == height",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/gfx/process.cpp"
                          ,0x139,"Png");
          }
          cVar6 = png_get_color_type(this->png,this->info);
          if (cVar6 != '\x06') {
            __assert_fail("png_get_color_type(png, info) == PNG_COLOR_TYPE_RGBA",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/gfx/process.cpp"
                          ,0x13b,"Png");
          }
          cVar6 = png_get_bit_depth(this->png,this->info);
          if (cVar6 != '\b') {
            __assert_fail("png_get_bit_depth(png, info) == 8",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/gfx/process.cpp"
                          ,0x13c,"Png");
          }
          __n = png_get_rowbytes(this->png,this->info);
          if (__n == 0) {
            __assert_fail("nbRowBytes != 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/gfx/process.cpp"
                          ,0x141,"Png");
          }
          std::
          vector<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::vector(&row,__n,(allocator_type *)&conflicts);
          conflicts.
          super__Vector_base<std::tuple<unsigned_int,_unsigned_int>,_std::allocator<std::tuple<unsigned_int,_unsigned_int>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          conflicts.
          super__Vector_base<std::tuple<unsigned_int,_unsigned_int>,_std::allocator<std::tuple<unsigned_int,_unsigned_int>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          conflicts.
          super__Vector_base<std::tuple<unsigned_int,_unsigned_int>,_std::allocator<std::tuple<unsigned_int,_unsigned_int>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          assignColor.indeterminates = &indeterminates;
          indeterminates.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          indeterminates.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          indeterminates.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          assignColor.this = this;
          assignColor.conflicts = &conflicts;
          if (interlaceType == 0) {
            for (uVar9 = 0; uVar9 < *local_e8; uVar9 = uVar9 + 1) {
              png_read_row(*pppVar1,CONCAT44(row.
                                             super__Vector_base<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                             (int)row.
                                                  super__Vector_base<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start),0);
              uVar17 = 0;
              for (uVar20 = 0; uVar20 < *local_f0; uVar20 = uVar20 + 1) {
                local_104 = *(Rgba *)(CONCAT44(row.
                                               super__Vector_base<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>
                                               ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                               (int)row.
                                                  super__Vector_base<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start) +
                                     (ulong)uVar17);
                Png::anon_class_24_3_904f71aa::operator()
                          (&assignColor,(png_uint_32)uVar20,uVar9,&local_104);
                uVar17 = uVar17 + 4;
              }
            }
          }
          else {
            if (interlaceType != 1) {
              __assert_fail("interlaceType == PNG_INTERLACE_ADAM7",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/gfx/process.cpp"
                            ,0x171,"Png");
            }
            local_a0 = 0;
            uVar20 = local_a0;
            while (local_a0 = uVar20, uVar9 = (uint)local_a0, uVar9 != 7) {
              bVar7 = (byte)(7 - uVar9 >> 1);
              if (uVar9 < 2) {
                bVar7 = 3;
              }
              iVar8 = 1 << (bVar7 & 0x1f);
              uVar20 = (ulong)(uVar9 + 1);
              uVar17 = (uVar9 & 1) << (3U - (char)(uVar9 + 1 >> 1) & 0x1f);
              local_d8 = (int *)(CONCAT44(local_d8._4_4_,uVar17) & 0xffffffff00000007);
              if (~(uVar17 & 7) + iVar8 + *local_f0 >> (bVar7 & 0x1f) != 0) {
                bVar7 = (byte)(8 - uVar9 >> 1);
                if (uVar9 < 3) {
                  bVar7 = 3;
                }
                iVar18 = 1 << (bVar7 & 0x1f);
                uVar17 = *local_e8;
                uVar9 = (uVar9 & 1 ^ 1) << (3U - (char)(local_a0 >> 1) & 0x1f) & 7;
                local_d0 = (Png *)CONCAT44(local_d0._4_4_,iVar18);
                if (~uVar9 + uVar17 + iVar18 >> (bVar7 & 0x1f) != 0) {
                  for (; uVar9 < uVar17; uVar9 = uVar9 + (int)local_d0) {
                    pRVar21 = (Rgba *)CONCAT44(row.
                                               super__Vector_base<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>
                                               ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                               (int)row.
                                                  super__Vector_base<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                    png_read_row(*pppVar1,pRVar21,0);
                    for (uVar17 = (uint)local_d8; uVar17 < *local_f0; uVar17 = uVar17 + iVar8) {
                      local_104 = *pRVar21;
                      Png::anon_class_24_3_904f71aa::operator()
                                (&assignColor,uVar17,uVar9,&local_104);
                      pRVar21 = pRVar21 + 1;
                    }
                    uVar17 = *local_e8;
                  }
                }
              }
            }
          }
          png_read_end(*pppVar1,0);
          std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                    (&indeterminates.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                    );
          std::
          _Vector_base<std::tuple<unsigned_int,_unsigned_int>,_std::allocator<std::tuple<unsigned_int,_unsigned_int>_>_>
          ::~_Vector_base(&conflicts.
                           super__Vector_base<std::tuple<unsigned_int,_unsigned_int>,_std::allocator<std::tuple<unsigned_int,_unsigned_int>_>_>
                         );
          std::
          _Vector_base<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::~_Vector_base(&row.
                           super__Vector_base<unsigned_char,_default_init_allocator<unsigned_char,_std::allocator<unsigned_char>_>_>
                         );
          return;
        }
        pcVar14 = "Image height (%u pixels) is not a multiple of 8!";
      }
      fatal(pcVar14);
    }
    png_destroy_read_struct(pppVar1,0,0);
    pcVar14 = "Failed to allocate PNG info structure: %s";
  }
  piVar16 = __errno_location();
  pcVar15 = strerror(*piVar16);
  fatal(pcVar14,pcVar15);
}

Assistant:

explicit Png(std::filesystem::path const &filePath) : path(filePath), colors() {
		if (file.open(path, std::ios_base::in | std::ios_base::binary) == nullptr) {
			fatal("Failed to open input image (\"%s\"): %s", file.string(path).c_str(),
			      strerror(errno));
		}

		options.verbosePrint(Options::VERB_LOG_ACT, "Opened input file\n");

		std::array<unsigned char, 8> pngHeader;

		if (file->sgetn(reinterpret_cast<char *>(pngHeader.data()), pngHeader.size())
		        != static_cast<std::streamsize>(pngHeader.size()) // Not enough bytes?
		    || png_sig_cmp(pngHeader.data(), 0, pngHeader.size()) != 0) {
			fatal("Input file (\"%s\") is not a PNG image!", file.string(path).c_str());
		}

		options.verbosePrint(Options::VERB_INTERM, "PNG header signature is OK\n");

		png = png_create_read_struct(PNG_LIBPNG_VER_STRING, (png_voidp)this, handleError,
		                             handleWarning);
		if (!png) {
			fatal("Failed to allocate PNG structure: %s", strerror(errno));
		}

		info = png_create_info_struct(png);
		if (!info) {
			png_destroy_read_struct(&png, nullptr, nullptr);
			fatal("Failed to allocate PNG info structure: %s", strerror(errno));
		}

		png_set_read_fn(png, this, readData);
		png_set_sig_bytes(png, pngHeader.size());

		// TODO: png_set_crc_action(png, PNG_CRC_ERROR_QUIT, PNG_CRC_WARN_DISCARD);

		// Skipping chunks we don't use should improve performance
		// TODO: png_set_keep_unknown_chunks(png, ...);

		// Process all chunks up to but not including the image data
		png_read_info(png, info);

		int bitDepth, interlaceType; //, compressionType, filterMethod;

		png_get_IHDR(png, info, &width, &height, &bitDepth, &colorType, &interlaceType, nullptr,
		             nullptr);

		if (options.inputSlice.width == 0 && width % 8 != 0) {
			fatal("Image width (%" PRIu32 " pixels) is not a multiple of 8!", width);
		}
		if (options.inputSlice.height == 0 && height % 8 != 0) {
			fatal("Image height (%" PRIu32 " pixels) is not a multiple of 8!", height);
		}

		pixels.resize(static_cast<size_t>(width) * static_cast<size_t>(height));

		auto colorTypeName = [this]() {
			switch (colorType) {
			case PNG_COLOR_TYPE_GRAY:
				return "grayscale";
			case PNG_COLOR_TYPE_GRAY_ALPHA:
				return "grayscale + alpha";
			case PNG_COLOR_TYPE_PALETTE:
				return "palette";
			case PNG_COLOR_TYPE_RGB:
				return "RGB";
			case PNG_COLOR_TYPE_RGB_ALPHA:
				return "RGB + alpha";
			default:
				fatal("Unknown color type %d", colorType);
			}
		};
		auto interlaceTypeName = [&interlaceType]() {
			switch (interlaceType) {
			case PNG_INTERLACE_NONE:
				return "not interlaced";
			case PNG_INTERLACE_ADAM7:
				return "interlaced (Adam7)";
			default:
				fatal("Unknown interlace type %d", interlaceType);
			}
		};
		options.verbosePrint(Options::VERB_INTERM,
		                     "Input image: %" PRIu32 "x%" PRIu32 " pixels, %dbpp %s, %s\n", width,
		                     height, bitDepth, colorTypeName(), interlaceTypeName());

		if (png_get_PLTE(png, info, &embeddedPal, &nbColors) != 0) {
			int nbTransparentEntries;
			if (png_get_tRNS(png, info, &transparencyPal, &nbTransparentEntries, nullptr)) {
				assert(nbTransparentEntries == nbColors);
			}

			options.verbosePrint(Options::VERB_INTERM, "Embedded palette has %d colors: [",
			                     nbColors);
			for (int i = 0; i < nbColors; ++i) {
				auto const &color = embeddedPal[i];
				options.verbosePrint(
				    Options::VERB_INTERM, "#%02x%02x%02x%02x%s", color.red, color.green, color.blue,
				    transparencyPal ? transparencyPal[i] : 0xFF, i != nbColors - 1 ? ", " : "]\n");
			}
		} else {
			options.verbosePrint(Options::VERB_INTERM, "No embedded palette\n");
		}

		// Set up transformations; to turn everything into RGBA888
		// TODO: it's not necessary to uniformize the pixel data (in theory), and not doing
		// so *might* improve performance, and should reduce memory usage.

		// Convert grayscale to RGB
		switch (colorType & ~PNG_COLOR_MASK_ALPHA) {
		case PNG_COLOR_TYPE_GRAY:
			png_set_gray_to_rgb(png); // This also converts tRNS to alpha
			break;
		case PNG_COLOR_TYPE_PALETTE:
			png_set_palette_to_rgb(png);
			break;
		}

		if (png_get_valid(png, info, PNG_INFO_tRNS)) {
			// If we read a tRNS chunk, convert it to alpha
			png_set_tRNS_to_alpha(png);
		} else if (!(colorType & PNG_COLOR_MASK_ALPHA)) {
			// Otherwise, if we lack an alpha channel, default to full opacity
			png_set_add_alpha(png, 0xFFFF, PNG_FILLER_AFTER);
		}

		// Scale 16bpp back to 8 (we don't need all of that precision anyway)
		if (bitDepth == 16) {
			png_set_scale_16(png);
		} else if (bitDepth < 8) {
			png_set_packing(png);
		}

		// Do NOT call `png_set_interlace_handling`. We want to expand the rows ourselves.

		// Update `info` with the transformations
		png_read_update_info(png, info);
		// These shouldn't have changed
		assert(png_get_image_width(png, info) == width);
		assert(png_get_image_height(png, info) == height);
		// These should have changed, however
		assert(png_get_color_type(png, info) == PNG_COLOR_TYPE_RGBA);
		assert(png_get_bit_depth(png, info) == 8);

		// Now that metadata has been read, we can process the image data

		size_t nbRowBytes = png_get_rowbytes(png, info);
		assert(nbRowBytes != 0);
		DefaultInitVec<png_byte> row(nbRowBytes);
		// Holds known-conflicting color pairs to avoid warning about them twice.
		// We don't need to worry about transitivity, as ImagePalette slots are immutable once
		// assigned, and conflicts always occur between that and another color.
		// For the same reason, we don't need to worry about order, either.
		std::vector<std::tuple<uint32_t, uint32_t>> conflicts;
		// Holds colors whose alpha value is ambiguous
		std::vector<uint32_t> indeterminates;

		// Assign a color to the given position, and register it in the image palette as well
		auto assignColor = [this, &conflicts, &indeterminates](png_uint_32 x, png_uint_32 y,
		                                                       Rgba &&color) {
			if (!color.isTransparent() && !color.isOpaque()) {
				uint32_t css = color.toCSS();
				if (std::find(indeterminates.begin(), indeterminates.end(), css)
				    == indeterminates.end()) {
					error("Color #%08x is neither transparent (alpha < %u) nor opaque (alpha >= "
					      "%u) [first seen at x: %" PRIu32 ", y: %" PRIu32 "]",
					      css, Rgba::transparency_threshold, Rgba::opacity_threshold, x, y);
					indeterminates.push_back(css);
				}
			} else if (Rgba const *other = colors.registerColor(color); other) {
				std::tuple conflicting{color.toCSS(), other->toCSS()};
				// Do not report combinations twice
				if (std::find(conflicts.begin(), conflicts.end(), conflicting) == conflicts.end()) {
					warning("Fusing colors #%08x and #%08x into Game Boy color $%04x [first seen "
					        "at x: %" PRIu32 ", y: %" PRIu32 "]",
					        std::get<0>(conflicting), std::get<1>(conflicting), color.cgbColor(), x,
					        y);
					// Do not report this combination again
					conflicts.emplace_back(conflicting);
				}
			}

			pixel(x, y) = color;
		};

		if (interlaceType == PNG_INTERLACE_NONE) {
			for (png_uint_32 y = 0; y < height; ++y) {
				png_read_row(png, row.data(), nullptr);

				for (png_uint_32 x = 0; x < width; ++x) {
					assignColor(x, y,
					            Rgba(row[x * 4], row[x * 4 + 1], row[x * 4 + 2], row[x * 4 + 3]));
				}
			}
		} else {
			assert(interlaceType == PNG_INTERLACE_ADAM7);

			// For interlace to work properly, we must read the image `nbPasses` times
			for (int pass = 0; pass < PNG_INTERLACE_ADAM7_PASSES; ++pass) {
				// The interlacing pass must be skipped if its width or height is reported as zero
				if (PNG_PASS_COLS(width, pass) == 0 || PNG_PASS_ROWS(height, pass) == 0) {
					continue;
				}

				png_uint_32 xStep = 1u << PNG_PASS_COL_SHIFT(pass);
				png_uint_32 yStep = 1u << PNG_PASS_ROW_SHIFT(pass);

				for (png_uint_32 y = PNG_PASS_START_ROW(pass); y < height; y += yStep) {
					png_bytep ptr = row.data();
					png_read_row(png, ptr, nullptr);

					for (png_uint_32 x = PNG_PASS_START_COL(pass); x < width; x += xStep) {
						assignColor(x, y, Rgba(ptr[0], ptr[1], ptr[2], ptr[3]));
						ptr += 4;
					}
				}
			}
		}

		// We don't care about chunks after the image data (comments, etc.)
		png_read_end(png, nullptr);
	}